

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

idx_t __thiscall duckdb::RadixHTConfig::SinkCapacity(RadixHTConfig *this)

{
  idx_t iVar1;
  ulong uVar2;
  
  uVar2 = 0x40;
  if (this->row_width < 0x40) {
    uVar2 = this->row_width;
  }
  iVar1 = NextPowerOfTwo(((this->number_of_threads * 0xc0000) / this->number_of_threads + 0x84000) /
                         (uVar2 + 10));
  if (iVar1 < 0x1001) {
    iVar1 = 0x1000;
  }
  return iVar1;
}

Assistant:

idx_t RadixHTConfig::SinkCapacity() const {
	// Compute cache size per active thread (assuming cache is shared)
	const auto total_shared_cache_size = number_of_threads * L3_CACHE_SIZE;
	const auto cache_per_active_thread = L1_CACHE_SIZE + L2_CACHE_SIZE + total_shared_cache_size / number_of_threads;

	// Divide cache per active thread by entry size, round up to next power of two, to get capacity
	const auto size_per_entry = LossyNumericCast<idx_t>(sizeof(ht_entry_t) * GroupedAggregateHashTable::LOAD_FACTOR) +
	                            MinValue(row_width, ROW_WIDTH_THRESHOLD_TWO);
	const auto capacity = NextPowerOfTwo(cache_per_active_thread / size_per_entry);

	// Capacity must be at least the minimum capacity
	return MaxValue<idx_t>(capacity, GroupedAggregateHashTable::InitialCapacity());
}